

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_suite1.cpp
# Opt level: O2

void test_suite1(fctkern_t *fctkern_ptr__)

{
  fct_clp_t *clp_00;
  fct_nlist_t *list;
  undefined8 uVar1;
  undefined8 uVar2;
  ts_mode tVar3;
  size_t sVar4;
  FILE *__stream;
  int iVar5;
  int iVar6;
  uint uVar7;
  fct_ts_t *pfVar8;
  char *__s;
  char *option;
  char *pcVar9;
  fctcl_t *clo;
  size_t sVar10;
  undefined8 *puVar11;
  fct_logger_i *itm;
  void *pvVar12;
  fct_test_t *pfVar13;
  char **ppcVar14;
  char *buffer_len;
  char *pcVar15;
  long *plVar16;
  long lVar17;
  fct_clp_t *clp;
  int iVar18;
  size_t sVar19;
  int local_80;
  char *err;
  undefined1 local_48 [16];
  
  pfVar8 = (fct_ts_t *)calloc(1,0x128);
  if (pfVar8 == (fct_ts_t *)0x0) {
    __assert_fail("ts != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x483
                  ,"fct_ts_t *fct_ts_new(const char *)");
  }
  fctstr_safe_cpy(pfVar8->name,"test_suite1",0x100);
  pfVar8->mode = ts_mode_cnt;
  fct_nlist__init2(&pfVar8->test_list,8);
  (fctkern_ptr__->ns).ts_curr = pfVar8;
  if (fctkern_ptr__->cl_is_parsed != 0) goto LAB_00104931;
  if ((fctkern_ptr__->cl_user_opts == (fctcl_init_t *)0x0) ||
     (iVar5 = fct_clp__add_options(&fctkern_ptr__->cl_parser,fctkern_ptr__->cl_user_opts),
     iVar5 != 0)) {
    clp_00 = &fctkern_ptr__->cl_parser;
    iVar5 = fct_clp__add_options(clp_00,FCT_CLP_OPTIONS);
    if (iVar5 == 0) goto LAB_0010464a;
    iVar5 = fctkern_ptr__->cl_argc;
    ppcVar14 = fctkern_ptr__->cl_argv;
    pcVar15 = (fctkern_ptr__->cl_parser).error_msg;
    (fctkern_ptr__->cl_parser).error_msg[0] = '\0';
    (fctkern_ptr__->cl_parser).is_error = 0;
    list = &(fctkern_ptr__->cl_parser).param_list;
    for (iVar18 = 1; iVar18 < iVar5; iVar18 = iVar18 + 1) {
      __s = fctstr_clone(ppcVar14[iVar18]);
      option = strtok(__s,"=");
      pcVar9 = strtok((char *)0x0,"=");
      sVar4 = (fctkern_ptr__->cl_parser).clo_list.used_itm_num;
      sVar19 = 0;
      do {
        if (sVar4 == sVar19) {
          if ((fctkern_ptr__->cl_parser).is_error != 0) goto LAB_00104cfc;
          fct_nlist__append(list,__s);
          __s = (char *)0x0;
          goto LAB_00104635;
        }
        clo = (fctcl_t *)fct_nlist__at(&clp_00->clo_list,sVar19);
        buffer_len = option;
        iVar6 = fctcl__is_option(clo,option);
        sVar19 = sVar19 + 1;
      } while (iVar6 == 0);
      if (clo->action == FCTCL_STORE_TRUE) {
        pcVar9 = fctstr_clone("1");
LAB_0010461f:
        clo->value = pcVar9;
      }
      else if (clo->action == FCTCL_STORE_VALUE) {
        if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
          iVar18 = iVar18 + 1;
          if (iVar5 <= iVar18) {
            fct_snprintf(pcVar15,(size_t)buffer_len,"missing argument for %s",option);
            (fctkern_ptr__->cl_parser).is_error = 1;
            goto LAB_00104cfc;
          }
          pcVar9 = ppcVar14[iVar18];
        }
        pcVar9 = fctstr_clone(pcVar9);
        goto LAB_0010461f;
      }
      if ((fctkern_ptr__->cl_parser).is_error != 0) goto LAB_00104cfc;
LAB_00104635:
      free(__s);
    }
    if ((fctkern_ptr__->cl_parser).is_error != 0) {
LAB_00104cfc:
      fprintf(_stderr,"error: %s",pcVar15);
      goto LAB_0010464a;
    }
    sVar4 = (fctkern_ptr__->cl_parser).param_list.used_itm_num;
    for (sVar19 = 0; sVar4 != sVar19; sVar19 = sVar19 + 1) {
      pcVar15 = (char *)fct_nlist__at(list,sVar19);
      if (pcVar15 == (char *)0x0) {
        __assert_fail("prefix_filter != __null && \"invalid arg\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x7de,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
      }
      sVar10 = strlen(pcVar15);
      if (sVar10 == 0) {
        __assert_fail("strlen(prefix_filter) > 0 && \"invalid arg\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x7df,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
      }
      pcVar9 = (char *)malloc(sVar10 + 1);
      fctstr_safe_cpy(pcVar9,pcVar15,sVar10 + 1);
      fct_nlist__append(&fctkern_ptr__->prefix_list,pcVar9);
    }
    iVar5 = fctkern__cl_is(fctkern_ptr__,"--version");
    if (iVar5 == 0) {
      iVar5 = fctkern__cl_is(fctkern_ptr__,"--help");
      __stream = _stdout;
      if (iVar5 == 0) {
        pcVar15 = fct_clp__optval2(clp_00,"--logger","standard");
        if (pcVar15 == (char *)0x0) {
          __assert_fail("sel_logger != __null && \"should never be NULL\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                        ,0x82f,"int fctkern__cl_parse_config_logger(fctkern_t *)");
        }
        if (fctkern_ptr__->lt_usr == (fct_logger_types_t *)0x0) {
          itm = (fct_logger_i *)0x0;
        }
        else {
          itm = fckern_sel_log(fctkern_ptr__->lt_usr,pcVar15);
        }
        if (itm == (fct_logger_i *)0x0 && fctkern_ptr__->lt_sys != (fct_logger_types_t *)0x0) {
          itm = fckern_sel_log(fctkern_ptr__->lt_sys,pcVar15);
        }
        if (itm == (fct_logger_i *)0x0) {
          local_80 = -1;
          iVar5 = 0;
          fprintf(_stderr,"error: unknown logger selected - \'%s\'",pcVar15);
          goto LAB_001048e2;
        }
        fct_nlist__append(&fctkern_ptr__->logger_list,itm);
        fctkern_ptr__->cl_is_parsed = 1;
        local_80 = 1;
      }
      else {
        local_80 = -1;
        fwrite("test.exe [options] prefix_filter ...\n\n",0x26,1,_stdout);
        sVar4 = (fctkern_ptr__->cl_parser).clo_list.used_itm_num;
        for (sVar19 = 0; sVar19 != sVar4; sVar19 = sVar19 + 1) {
          puVar11 = (undefined8 *)fct_nlist__at(&clp_00->clo_list,sVar19);
          if (puVar11[1] == 0) {
            fprintf(__stream,"%s\n",*puVar11);
          }
          else {
            fprintf(__stream,"%s, %s\n");
          }
          iVar5 = fctstr_ieq((char *)*puVar11,"--logger");
          if (iVar5 == 0) {
            pcVar15 = (char *)puVar11[3];
            pcVar9 = "  %s\n";
          }
          else {
            uVar1 = fctkern_ptr__->lt_usr;
            uVar2 = fctkern_ptr__->lt_sys;
            local_48._8_4_ = (int)uVar1;
            local_48._0_8_ = uVar2;
            local_48._12_4_ = (int)((ulong)uVar1 >> 0x20);
            fputs("  Sets the logger. The types of loggers currently available are,\n",__stream);
            for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
              for (plVar16 = *(long **)(local_48 + lVar17 * 8);
                  (plVar16 != (long *)0x0 && (*plVar16 != 0)); plVar16 = plVar16 + 3) {
                fprintf(__stream,"   =%s : %s\n",*plVar16,plVar16[2]);
              }
            }
            pcVar9 = "  default is \'%s\'.\n";
            pcVar15 = "standard";
          }
          fprintf(__stream,pcVar9,pcVar15);
        }
        fputs("\n",__stream);
      }
      iVar5 = 0;
    }
    else {
      local_80 = -1;
      iVar5 = 0;
      printf("Built using FCTX version %s.\n");
    }
  }
  else {
LAB_0010464a:
    local_80 = 0;
    iVar5 = 1;
  }
LAB_001048e2:
  sVar4 = (fctkern_ptr__->logger_list).used_itm_num;
  for (sVar19 = 0; sVar4 != sVar19; sVar19 = sVar19 + 1) {
    pvVar12 = fct_nlist__at(&fctkern_ptr__->logger_list,sVar19);
    *(fctkern_t **)((long)pvVar12 + 0x58) = fctkern_ptr__;
    (**(code **)((long)pvVar12 + 0x28))(pvVar12);
  }
  if (local_80 + 1U < 2) {
    fct_ts__del((fctkern_ptr__->ns).ts_curr);
    fctkern__final(fctkern_ptr__);
    exit(iVar5);
  }
  pfVar8 = (fctkern_ptr__->ns).ts_curr;
  if (pfVar8 == (fct_ts_t *)0x0) {
    fctkern__log_warn(fctkern_ptr__,"out of memory");
    return;
  }
LAB_00104931:
  sVar4 = (fctkern_ptr__->logger_list).used_itm_num;
  for (sVar19 = 0; sVar4 != sVar19; sVar19 = sVar19 + 1) {
    pvVar12 = fct_nlist__at(&fctkern_ptr__->logger_list,sVar19);
    *(fct_ts_t **)((long)pvVar12 + 0x70) = pfVar8;
    (**(code **)((long)pvVar12 + 0x18))(pvVar12);
  }
  do {
    (fctkern_ptr__->ns).test_num = -1;
    pfVar8 = (fctkern_ptr__->ns).ts_curr;
    tVar3 = pfVar8->mode;
    switch(tVar3) {
    case ts_mode_setup:
      pfVar8->mode = ts_mode_test;
      (fctkern_ptr__->ns).curr_test_name = "simple__one_is_one";
      (fctkern_ptr__->ns).test_num = 0;
LAB_001049ec:
      iVar5 = fct_ts__is_test_cnt(pfVar8,0);
      pfVar8 = (fctkern_ptr__->ns).ts_curr;
      if (iVar5 == 0) goto LAB_00104a94;
      fct_ts__test_begin(pfVar8);
      iVar5 = fctkern__pass_filter(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name);
      if (iVar5 != 0) {
        pfVar13 = fct_test_new((fctkern_ptr__->ns).curr_test_name);
        (fctkern_ptr__->ns).curr_test = pfVar13;
        if (pfVar13 == (fct_test_t *)0x0) {
LAB_00104b48:
          fctkern__log_warn(fctkern_ptr__,"out of memory");
        }
        else {
          if (((fctkern_ptr__->ns).ts_is_skip_suite != 0) || ((fctkern_ptr__->ns).test_is_skip != 0)
             ) {
LAB_00104b02:
            fct_ts__test_begin((fctkern_ptr__->ns).ts_curr);
            ppcVar14 = &(fctkern_ptr__->ns).test_skip_cndtn;
            if ((fctkern_ptr__->ns).test_is_skip == 0) {
              ppcVar14 = &(fctkern_ptr__->ns).ts_skip_cndtn;
            }
            fctkern__log_test_skip(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name,*ppcVar14);
            goto LAB_00104b6f;
          }
          fctkern__log_test_start(fctkern_ptr__,pfVar13);
          fct_test__start_timer((fctkern_ptr__->ns).curr_test);
          fct_xchk_test = (fctkern_ptr__->ns).curr_test;
          fct_xchk_lineno = 0x1b;
          fct_xchk_file =
               "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O2/tests/test_multi_suite1.cpp"
          ;
          uVar7 = 1;
          pcVar15 = "1";
          fct_xchk_kern = fctkern_ptr__;
LAB_00104c18:
          fct_xchk_fn(uVar7,pcVar15);
          fct_test__stop_timer((fctkern_ptr__->ns).curr_test);
        }
        fct_ts__add_test((fctkern_ptr__->ns).ts_curr,(fctkern_ptr__->ns).curr_test);
        fctkern__log_test_end(fctkern_ptr__,(fctkern_ptr__->ns).curr_test);
      }
LAB_00104b6f:
      fct_ts__test_end((fctkern_ptr__->ns).ts_curr);
      break;
    case ts_mode_teardown:
      pfVar8->mode = (uint)(pfVar8->total_test_num <= pfVar8->curr_test_num) * 3 + ts_mode_setup;
      break;
    default:
      (fctkern_ptr__->ns).curr_test_name = "simple__one_is_one";
      (fctkern_ptr__->ns).test_num = 0;
      if (tVar3 == ts_mode_test) goto LAB_001049ec;
      if (tVar3 == ts_mode_cnt) {
        fct_ts__inc_total_test_num(pfVar8);
        pfVar8 = (fctkern_ptr__->ns).ts_curr;
      }
LAB_00104a94:
      (fctkern_ptr__->ns).curr_test_name = "simple__check_streq";
      iVar5 = (fctkern_ptr__->ns).test_num + 1;
      (fctkern_ptr__->ns).test_num = iVar5;
      if (pfVar8->mode == ts_mode_test) {
        iVar5 = fct_ts__is_test_cnt(pfVar8,iVar5);
        pfVar8 = (fctkern_ptr__->ns).ts_curr;
        if (iVar5 != 0) {
          fct_ts__test_begin(pfVar8);
          iVar5 = fctkern__pass_filter(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name);
          if (iVar5 != 0) {
            pfVar13 = fct_test_new((fctkern_ptr__->ns).curr_test_name);
            (fctkern_ptr__->ns).curr_test = pfVar13;
            if (pfVar13 != (fct_test_t *)0x0) {
              if (((fctkern_ptr__->ns).ts_is_skip_suite != 0) ||
                 ((fctkern_ptr__->ns).test_is_skip != 0)) goto LAB_00104b02;
              fctkern__log_test_start(fctkern_ptr__,pfVar13);
              fct_test__start_timer((fctkern_ptr__->ns).curr_test);
              fct_xchk_test = (fctkern_ptr__->ns).curr_test;
              fct_xchk_lineno = 0x20;
              fct_xchk_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O2/tests/test_multi_suite1.cpp"
              ;
              fct_xchk_kern = fctkern_ptr__;
              iVar5 = streq("one",(char *)pfVar13);
              pcVar15 = "streq(\"one\", \"one\")";
              fct_xchk_fn(iVar5,"streq(\"one\", \"one\")");
              fct_xchk_test = (fctkern_ptr__->ns).curr_test;
              fct_xchk_lineno = 0x21;
              fct_xchk_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O2/tests/test_multi_suite1.cpp"
              ;
              fct_xchk_kern = fctkern_ptr__;
              uVar7 = streq("two",pcVar15);
              uVar7 = uVar7 ^ 1;
              pcVar15 = "!streq(\"one\", \"two\")";
              goto LAB_00104c18;
            }
            goto LAB_00104b48;
          }
          goto LAB_00104b6f;
        }
      }
      else if (pfVar8->mode == ts_mode_cnt) {
        fct_ts__inc_total_test_num(pfVar8);
        pfVar8 = (fctkern_ptr__->ns).ts_curr;
      }
      if (pfVar8->mode == ts_mode_cnt) {
        pfVar8->mode = (uint)(pfVar8->total_test_num == 0) * 3 + ts_mode_setup;
      }
      break;
    case ts_mode_ending:
    case ts_mode_abort:
      pfVar8->mode = ts_mode_end;
      fct_nlist__append(&fctkern_ptr__->ts_list,pfVar8);
      pfVar8 = (fctkern_ptr__->ns).ts_curr;
      if (pfVar8 != (fct_ts_t *)0x0) {
        sVar4 = (fctkern_ptr__->logger_list).used_itm_num;
        for (sVar19 = 0; sVar4 != sVar19; sVar19 = sVar19 + 1) {
          pvVar12 = fct_nlist__at(&fctkern_ptr__->logger_list,sVar19);
          *(fct_ts_t **)((long)pvVar12 + 0x70) = pfVar8;
          (**(code **)((long)pvVar12 + 0x20))(pvVar12,(long)pvVar12 + 0x58);
        }
        ((fctkern_ptr__->ns).ts_curr)->mode = ts_mode_end;
        (fctkern_ptr__->ns).ts_curr = (fct_ts_t *)0x0;
        return;
      }
      __assert_fail("ts != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x923,"void fctkern__log_suite_end(fctkern_t *, const fct_ts_t *)");
    }
  } while( true );
}

Assistant:

FCTMF_SUITE_BGN(test_suite1)
{
    FCT_TEST_BGN(simple__one_is_one)
    {
        fct_chk(1);
    }
    FCT_TEST_END();
    FCT_TEST_BGN(simple__check_streq)
    {
        fct_chk(streq("one", "one"));
        fct_chk(!streq("one", "two"));
    }
    FCT_TEST_END();
}